

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirOPT(void)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  int n;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  byte local_861;
  char *local_860;
  vector<char_*,_std::allocator<char_*>_> parsedOptsArray;
  char parsedOpts [2048];
  
  local_861 = DAT_0018a50c;
  bVar1 = false;
  while ((iVar2 = SkipBlanks(&lp), iVar2 == 0 && (*lp != '-'))) {
    iVar2 = cmphstr(&lp,"pop",false);
    if (iVar2 != 0) {
      bVar1 = Options::SSyntax::popSyntax();
      if (bVar1) {
        return;
      }
      Warning("[OPT] no previous syntax found",(char *)0x0,W_PASS3);
      return;
    }
    iVar2 = cmphstr(&lp,"push",false);
    if (iVar2 == 0) {
      iVar2 = cmphstr(&lp,"reset",false);
      if (iVar2 == 0) {
        iVar2 = cmphstr(&lp,"listoff",false);
        if (iVar2 == 0) {
          iVar2 = cmphstr(&lp,"liston",false);
          if (iVar2 == 0) {
            iVar2 = cmphstr(&lp,"listall",false);
            if (iVar2 == 0) {
              iVar2 = cmphstr(&lp,"listact",false);
              if (iVar2 == 0) {
                iVar2 = cmphstr(&lp,"listmc",false);
                if (iVar2 == 0) {
                  Error("[OPT] invalid command (valid commands: push, pop, reset, liston, listoff, listall, listact, listmc)"
                        ,lp,PASS3);
                  SkipToEol(&lp);
                  return;
                }
                if ((local_861 & 1) == 0) {
                  ListFile(false);
                }
                donotlist = 1;
                DAT_0018a510 = 2;
                local_861 = 1;
              }
              else {
                if ((local_861 & 1) == 0) {
                  ListFile(false);
                }
                DAT_0018a510 = 1;
                local_861 = 1;
                donotlist = DAT_0018a510;
              }
            }
            else {
              if ((local_861 & 1) == 0) {
                ListFile(false);
              }
              donotlist = 1;
              DAT_0018a510 = 0;
              local_861 = 1;
            }
          }
          else {
            DAT_0018a50c = 0;
          }
        }
        else {
          if ((local_861 & 1) == 0) {
            ListFile(false);
            __stream = (FILE *)GetListingFile();
            if ((__stream != (FILE *)0x0) && (pass == 3)) {
              fputs("# listing file suspended...\n",__stream);
            }
          }
          donotlist = 1;
          DAT_0018a50c = 1;
          local_861 = 1;
        }
      }
      else {
        Options::SSyntax::resetCurrentSyntax();
        bVar1 = true;
      }
    }
    else {
      if (bVar1) {
        Warning("[OPT] pushing syntax status after reset",(char *)0x0,W_PASS3);
      }
      Options::SSyntax::pushCurrentSyntax();
    }
  }
  parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = 0;
  while (iVar2 = SkipBlanks(&lp), iVar2 == 0) {
    lVar5 = (long)(int)lVar6;
    local_860 = parsedOpts + lVar5;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)&parsedOptsArray,&local_860);
    lVar4 = lVar5 << 0x20;
    while ((lVar6 = lVar5 + 1, *lp != '\0' && (bVar1 = White(), !bVar1))) {
      parsedOpts[lVar5] = *lp;
      lVar4 = lVar4 + 0x100000000;
      lVar5 = lVar6;
      lp = lp + 1;
    }
    parsedOpts[lVar4 >> 0x20] = '\0';
  }
  uVar3 = (long)parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_860 = (char *)0x0;
  std::vector<char*,std::allocator<char*>>::emplace_back<char*>
            ((vector<char*,std::allocator<char*>> *)&parsedOptsArray,&local_860);
  n = (int)(uVar3 >> 3);
  iVar2 = Options::parseSyntaxOptions
                    (n,parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
  if (iVar2 != n) {
    Error("[OPT] invalid/failed option",
          parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2],PASS3);
  }
  if (DAT_0018a51c != 0) {
    Z80::InitNextExtensions();
  }
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&parsedOptsArray.super__Vector_base<char_*,_std::allocator<char_*>_>);
  return;
}

Assistant:

static void dirOPT() {
	// supported options: --zxnext[=cspect] --reversepop --dirbol --nofakes --syntax=<...> -W...
	// process OPT specific command keywords first: {push, pop, reset, listoff, liston, listall, listact, listmc}
	bool didReset = false, didList = Options::syx.IsListingSuspended;
	while (!SkipBlanks(lp) && '-' != *lp) {
		if (cmphstr(lp, "pop")) {	// "pop" previous syntax state
			if (!Options::SSyntax::popSyntax()) Warning("[OPT] no previous syntax found");
			return;
		} else if (cmphstr(lp, "push")) {	// "push" previous syntax state
			if (didReset) Warning("[OPT] pushing syntax status after reset");
			// preserve current syntax status, before using arguments of OPT
			Options::SSyntax::pushCurrentSyntax();
		} else if (cmphstr(lp, "reset")) {	// keep current syntax state
			Options::SSyntax::resetCurrentSyntax();
			didReset = true;
		} else if (cmphstr(lp, "listoff")) {
			if (!didList) {
				ListFile();		// *list* the OPT line suspending the listing
				// show in listing file that some part was suspended
				FILE* listFile = GetListingFile();
				if (LASTPASS == pass && listFile) fputs("# listing file suspended...\n", listFile);
			}
			donotlist = 1;
			Options::syx.IsListingSuspended = didList = true;
		} else if (cmphstr(lp, "liston")) {
			Options::syx.IsListingSuspended = false;
		} else if (cmphstr(lp, "listall")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_ALL;
		} else if (cmphstr(lp, "listact")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_ACTIVE;
		} else if (cmphstr(lp, "listmc")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_MC_ONLY;
		} else {
			Error("[OPT] invalid command (valid commands: push, pop, reset, liston, listoff, listall, listact, listmc)", lp);
			SkipToEol(lp);
			return;
		}
	}
	// split user arguments into "argc, argv" like variables (by white-space)
	char parsedOpts[LINEMAX];
	std::vector<char*> parsedOptsArray;
	int charI = 0, errI;
	while (!SkipBlanks(lp)) {
		parsedOptsArray.push_back(parsedOpts + charI);
		while (*lp && !White()) parsedOpts[charI++] = *lp++;
		parsedOpts[charI++] = 0;
	}
	int optI = parsedOptsArray.size();
	parsedOptsArray.push_back(nullptr);
	// parse user arguments and adjust current syntax setup
	if (optI != (errI = Options::parseSyntaxOptions(optI, parsedOptsArray.data()))) {
		Error("[OPT] invalid/failed option", parsedOptsArray[errI]);
	}
	// init Z80N extensions if requested (the Init is safe to be called multiple times)
	if (Options::syx.IsNextEnabled) Z80::InitNextExtensions();
}